

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int rede_add_entry(file_info *file)

{
  file_info *pfVar1;
  
  pfVar1 = file;
  do {
    pfVar1 = pfVar1->parent;
    if (pfVar1 == (file_info *)0x0) {
      return -1;
    }
  } while (pfVar1->re == '\0');
  file->re_next = (file_info *)0x0;
  *(pfVar1->rede_files).last = file;
  (pfVar1->rede_files).last = &file->re_next;
  return 0;
}

Assistant:

static inline int
rede_add_entry(struct file_info *file)
{
	struct file_info *re;

	/*
	 * Find "RE" entry.
	 */
	re = file->parent;
	while (re != NULL && !re->re)
		re = re->parent;
	if (re == NULL)
		return (-1);

	file->re_next = NULL;
	*re->rede_files.last = file;
	re->rede_files.last = &(file->re_next);
	return (0);
}